

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O0

bool __thiscall
stream::inno_lzma1_decompressor_impl::filter
          (inno_lzma1_decompressor_impl *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long lVar3;
  bool bVar4;
  undefined8 uVar5;
  lzma_stream *plVar6;
  long in_RDX;
  long *in_RSI;
  lzma_error *in_RDI;
  lzma_options_lzma *in_stack_00000008;
  lzma_vli in_stack_00000010;
  uint8_t properties;
  lzma_options_lzma options;
  char *in_stack_fffffffffffffef8;
  string *msg;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff8f;
  char *in_stack_ffffffffffffff90;
  char **in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  lzma_decompressor_impl_base *in_stack_ffffffffffffffb0;
  
  if (*(long *)in_RDI == 0) {
    while (*(long *)&in_RDI->field_0x8 != 5) {
      if (*in_RSI == in_RDX) {
        return true;
      }
      puVar2 = (undefined1 *)*in_RSI;
      *in_RSI = (long)(puVar2 + 1);
      uVar1 = *puVar2;
      lVar3 = *(long *)&in_RDI->field_0x8;
      *(long *)&in_RDI->field_0x8 = lVar3 + 1;
      (&in_RDI->field_0x10)[lVar3] = uVar1;
    }
    if (0xe1 < (byte)in_RDI->field_0x10) {
      uVar5 = __cxa_allocate_exception(0x28);
      msg = (string *)&stack0xffffffffffffff2f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      lzma_error::lzma_error(in_RDI,msg,(int)((ulong)uVar5 >> 0x20));
      __cxa_throw(uVar5,&lzma_error::typeinfo,slice_error::~slice_error);
    }
    util::endianness<util::little_endian>::load<unsigned_int>(in_stack_fffffffffffffef8);
    plVar6 = init_raw_lzma_stream(in_stack_00000010,in_stack_00000008);
    *(lzma_stream **)in_RDI = plVar6;
  }
  bVar4 = lzma_decompressor_impl_base::filter
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (bool)in_stack_ffffffffffffff8f);
  return bVar4;
}

Assistant:

bool inno_lzma1_decompressor_impl::filter(const char * & begin_in, const char * end_in,
                                          char * & begin_out, char * end_out, bool flush) {
	
	// Decode the header.
	if(!stream) {
		
		// Read enough bytes to decode the header.
		while(nread != 5) {
			if(begin_in == end_in) {
				return true;
			}
			header[nread++] = *begin_in++;
		}
		
		lzma_options_lzma options;
		
		boost::uint8_t properties = boost::uint8_t(header[0]);
		if(properties > (9 * 5 * 5)) {
			throw lzma_error("inno lzma1 property error", LZMA_FORMAT_ERROR);
		}
		options.pb = boost::uint32_t(properties / (9 * 5));
		options.lp = boost::uint32_t((properties % (9 * 5)) / 9);
		options.lc = boost::uint32_t(properties % 9);
		
		options.dict_size = util::little_endian::load<boost::uint32_t>(header + 1);
		
		stream = init_raw_lzma_stream(LZMA_FILTER_LZMA1, options);
	}
	
	return lzma_decompressor_impl_base::filter(begin_in, end_in, begin_out, end_out, flush);
}